

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::SampleMeanWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  size_t *psVar1;
  double dVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  reference pvVar7;
  size_type sVar8;
  reference ppVar9;
  reference ppVar10;
  reference piVar11;
  pointer ppVar12;
  mapped_type *pmVar13;
  size_type sVar14;
  reference ppVar15;
  mapped_type *pmVar16;
  undefined4 in_register_0000000c;
  long *plVar17;
  float fVar18;
  int in_stack_00000008;
  float local_2f8;
  code *local_2f0;
  code *local_290;
  summary_id_period_key sStack_248;
  pair<const_summary_id_period_key,_lossval> s_1;
  iterator __end3_1;
  iterator __begin3_1;
  map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
  *__range3_1;
  _Self local_208;
  iterator iter_1;
  summary_id_period_key sk_1;
  int sidx;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  int iStack_1d0;
  pair<const_outkey2,_OutLosses> x_1;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> ensemble;
  iterator __end2;
  iterator __begin2;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range2;
  summary_id_period_key sStack_168;
  pair<const_summary_id_period_key,_lossval> s;
  iterator __end1_1;
  iterator __begin1_1;
  map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
  *__range1_1;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  mean_map;
  _Self local_f8;
  iterator iter;
  summary_id_period_key sk;
  pair<const_outkey2,_OutLosses> x;
  _Self local_c8;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  undefined1 local_a0 [8];
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
  items;
  int eptype_local;
  int epcalc_local;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  if (this->samplesize_ != 0) {
    std::
    map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
    ::map((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
           *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               local_a0,&this->periodstoweighting_);
    pvVar7 = std::
             vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             ::operator[](this->out_loss_,1);
    __end1 = std::
             map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
             ::begin(pvVar7);
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
         ::end(pvVar7);
    while (bVar6 = std::operator!=(&__end1,&local_c8), bVar6) {
      ppVar10 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end1);
      x.first.sidx = (int)(ppVar10->second).max_out_loss;
      sk.summary_id = (ppVar10->first).summary_id;
      sk.period_no = (ppVar10->first).period_no;
      x.first._0_8_ = *(undefined8 *)&(ppVar10->first).sidx;
      iter._M_node._0_4_ = sk.summary_id;
      iter._M_node._4_4_ = sk.period_no;
      local_f8._M_node =
           (_Base_ptr)
           std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           find(&this->periodstoweighting_,&sk.period_no);
      mean_map._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::end(&this->periodstoweighting_);
      bVar6 = std::operator!=(&local_f8,
                              (_Self *)&mean_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar6) {
        ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->(&local_f8);
        dVar2 = ppVar12->second;
        pmVar13 = std::
                  map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                  ::operator[]((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                                *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count,(key_type *)&iter);
        pmVar13->period_weighting = dVar2;
        iVar3 = sk.period_no;
        pmVar13 = std::
                  map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                  ::operator[]((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                                *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count,(key_type *)&iter);
        pmVar13->period_no = iVar3;
        plVar17 = (long *)((long)&x.first.period_no + CONCAT44(in_register_0000000c,epcalc));
        local_290 = (code *)GetOutLoss;
        if ((GetOutLoss & 1) != 0) {
          local_290 = *(code **)(*plVar17 + (GetOutLoss - 1));
        }
        fVar18 = (float)(*local_290)(plVar17);
        iVar3 = this->samplesize_;
        pmVar13 = std::
                  map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                  ::operator[]((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                                *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count,(key_type *)&iter);
        pmVar13->value = fVar18 / (float)iVar3 + pmVar13->value;
      }
      std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::erase
                ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *
                 )local_a0,&sk.period_no);
      std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end1);
    }
    std::
    map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
    ::map((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
           *)&__range1_1);
    psVar1 = &unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1_1 = std::
               map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
               ::begin((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                        *)psVar1);
    s.second._16_8_ =
         std::
         map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
         ::end((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                *)psVar1);
    while (bVar6 = std::operator!=(&__end1_1,(_Self *)&s.second.value), bVar6) {
      ppVar15 = std::_Rb_tree_iterator<std::pair<const_summary_id_period_key,_lossval>_>::operator*
                          (&__end1_1);
      sStack_168 = ppVar15->first;
      s.first.summary_id = (ppVar15->second).period_no;
      s.first.period_no = *(int *)&(ppVar15->second).field_0x4;
      s.second._0_8_ = (ppVar15->second).period_weighting;
      s.second.period_weighting = *(double *)&(ppVar15->second).value;
      pmVar16 = std::
                map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                ::operator[]((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                              *)&__range1_1,&sStack_168.summary_id);
      std::vector<lossval,_std::allocator<lossval>_>::push_back(pmVar16,(value_type *)&s);
      std::_Rb_tree_iterator<std::pair<const_summary_id_period_key,_lossval>_>::operator++
                (&__end1_1);
    }
    WriteExceedanceProbabilityTable
              (this,fileIDs,
               (map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                *)&__range1_1,(float)this->samplesize_,eptype,eptype_tvar,in_stack_00000008,
               (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               local_a0,1);
    if (((this->ordFlag_ & 1U) == 0) &&
       (sVar8 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::size(&this->ensembletosidx_), sVar8 != 0)) {
      __end2 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::begin(&this->ensembletosidx_);
      ensemble.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::end(&this->ensembletosidx_);
      while (bVar6 = std::operator!=(&__end2,(_Self *)&ensemble.second.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data.
                                                       _M_end_of_storage), bVar6) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                 operator*(&__end2);
        std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                  ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&__range3,ppVar9);
        std::
        map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
        ::clear((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                 *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
        operator=((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)local_a0,&this->periodstoweighting_);
        pvVar7 = std::
                 vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                 ::operator[](this->out_loss_,1);
        __end3 = std::
                 map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                 ::begin(pvVar7);
        x_1.second = (OutLosses)
                     std::
                     map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                     ::end(pvVar7);
        while (bVar6 = std::operator!=(&__end3,(_Self *)&x_1.second), bVar6) {
          ppVar10 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end3)
          ;
          uVar4 = (ppVar10->first).summary_id;
          uVar5 = (ppVar10->first).period_no;
          x_1.first._0_8_ = *(undefined8 *)&(ppVar10->first).sidx;
          x_1.first.sidx = (int)(ppVar10->second).max_out_loss;
          __end4 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)&ensemble);
          register0x00000000 =
               std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)&ensemble);
          while (bVar6 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                             *)&sk_1.period_no), bVar6) {
            piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&__end4);
            sk_1.summary_id = *piVar11;
            if (x_1.first.summary_id == sk_1.summary_id) {
              iter_1._M_node._4_4_ = uVar4;
              local_208._M_node =
                   (_Base_ptr)
                   std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::find(&this->periodstoweighting_,&iStack_1d0);
              __range3_1 = (map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                            *)std::
                              map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                              ::end(&this->periodstoweighting_);
              bVar6 = std::operator!=(&local_208,(_Self *)&__range3_1);
              if (bVar6) {
                ppVar12 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                                    (&local_208);
                dVar2 = ppVar12->second;
                pmVar13 = std::
                          map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                          ::operator[]((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                                        *)&unusedperiodstoweighting._M_t._M_impl.
                                           super__Rb_tree_header._M_node_count,
                                       (key_type *)((long)&iter_1._M_node + 4));
                pmVar13->period_weighting = dVar2;
                pmVar13 = std::
                          map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                          ::operator[]((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                                        *)&unusedperiodstoweighting._M_t._M_impl.
                                           super__Rb_tree_header._M_node_count,
                                       (key_type *)((long)&iter_1._M_node + 4));
                pmVar13->period_no = uVar5;
                plVar17 = (long *)((long)&x_1.first.period_no +
                                  CONCAT44(in_register_0000000c,epcalc));
                local_2f0 = (code *)GetOutLoss;
                if ((GetOutLoss & 1) != 0) {
                  local_2f0 = *(code **)(*plVar17 + (GetOutLoss - 1));
                }
                fVar18 = (float)(*local_2f0)(plVar17);
                sVar14 = std::vector<int,_std::allocator<int>_>::size
                                   ((vector<int,_std::allocator<int>_> *)&ensemble);
                local_2f8 = (float)sVar14;
                pmVar13 = std::
                          map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                          ::operator[]((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                                        *)&unusedperiodstoweighting._M_t._M_impl.
                                           super__Rb_tree_header._M_node_count,
                                       (key_type *)((long)&iter_1._M_node + 4));
                pmVar13->value = fVar18 / local_2f8 + pmVar13->value;
              }
              std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              ::erase((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       *)local_a0,&iStack_1d0);
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end4);
          }
          std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end3);
        }
        std::
        map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
        ::clear((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                 *)&__range1_1);
        psVar1 = &unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end3_1 = std::
                   map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                   ::begin((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                            *)psVar1);
        s_1.second._16_8_ =
             std::
             map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
             ::end((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
                    *)psVar1);
        while (bVar6 = std::operator!=(&__end3_1,(_Self *)&s_1.second.value), bVar6) {
          ppVar15 = std::_Rb_tree_iterator<std::pair<const_summary_id_period_key,_lossval>_>::
                    operator*(&__end3_1);
          sStack_248 = ppVar15->first;
          s_1.first.summary_id = (ppVar15->second).period_no;
          s_1.first.period_no = *(int *)&(ppVar15->second).field_0x4;
          s_1.second._0_8_ = (ppVar15->second).period_weighting;
          s_1.second.period_weighting = *(double *)&(ppVar15->second).value;
          pmVar16 = std::
                    map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                    ::operator[]((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                                  *)&__range1_1,&sStack_248.summary_id);
          std::vector<lossval,_std::allocator<lossval>_>::push_back(pmVar16,(value_type *)&s_1);
          std::_Rb_tree_iterator<std::pair<const_summary_id_period_key,_lossval>_>::operator++
                    (&__end3_1);
        }
        WriteExceedanceProbabilityTable
                  (this,fileIDs,
                   (map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                    *)&__range1_1,(float)this->samplesize_,eptype,(int)__range3,in_stack_00000008,
                   (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)local_a0,1);
        std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair
                  ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&__range3);
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        operator++(&__end2);
      }
    }
    std::
    map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
    ::~map((map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
            *)&__range1_1);
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               local_a0);
    std::
    map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
    ::~map((map<summary_id_period_key,_lossval,_std::less<summary_id_period_key>,_std::allocator<std::pair<const_summary_id_period_key,_lossval>_>_>
            *)&unusedperiodstoweighting._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void aggreports::SampleMeanWithWeighting(const std::vector<int> &fileIDs,
	OASIS_FLOAT (OutLosses::*GetOutLoss)(), const int epcalc,
	const int eptype, const int eptype_tvar) {

  if (samplesize_ == 0) return;   // Prevent division by zero error

  std::map<summary_id_period_key, lossval> items;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  for (auto x : (*out_loss_)[SAMPLES]) {
    summary_id_period_key sk;
    sk.summary_id = x.first.summary_id;
    sk.period_no = x.first.period_no;
    auto iter = periodstoweighting_.find(x.first.period_no);
    if (iter != periodstoweighting_.end()) {
      items[sk].period_weighting = iter->second;
      items[sk].period_no = x.first.period_no;   // for debugging
      items[sk].value += ((x.second.*GetOutLoss)() / samplesize_);
    }
    unusedperiodstoweighting.erase(x.first.period_no);
  }

  std::map<int, lossvec2> mean_map;
  for (auto s : items) {
    mean_map[s.first.summary_id].push_back(s.second);
  }

  WriteExceedanceProbabilityTable(fileIDs, mean_map, samplesize_, epcalc,
				  eptype, eptype_tvar,
				  unusedperiodstoweighting);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      unusedperiodstoweighting = periodstoweighting_;
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    summary_id_period_key sk;
	    sk.summary_id = x.first.summary_id;
	    sk.period_no = x.first.period_no;
	    auto iter = periodstoweighting_.find(x.first.period_no);
	    if (iter != periodstoweighting_.end()) {
	      items[sk].period_weighting = iter->second;
	      items[sk].period_no = x.first.period_no;   // for debugging
	      items[sk].value += ((x.second.*GetOutLoss)() / ensemble.second.size());
	    }
	    unusedperiodstoweighting.erase(x.first.period_no);
	  }
	}
      }
      mean_map.clear();
      for (auto s : items) {
	mean_map[s.first.summary_id].push_back(s.second);
      }
      WriteExceedanceProbabilityTable(fileIDs, mean_map, samplesize_,
				      epcalc, ensemble.first, eptype_tvar,
				      unusedperiodstoweighting, 1);
    }
  }
}